

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<JPPVValuePair> * __thiscall
boost::shared_ptr<JPPVValuePair>::operator=
          (shared_ptr<JPPVValuePair> *this,shared_ptr<JPPVValuePair> *r)

{
  shared_ptr<JPPVValuePair> *in_RDI;
  shared_ptr<JPPVValuePair> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<JPPVValuePair> *)0x8d565e);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }